

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlimits.c
# Opt level: O2

int main(int argc,char **argv)

{
  functest p_Var1;
  int iVar2;
  int i;
  int iVar3;
  int iVar4;
  long lVar5;
  undefined4 *puVar6;
  size_t sVar7;
  uint uVar8;
  ulong uVar9;
  char *pcVar10;
  long lVar11;
  bool bVar12;
  size_t sStack_40;
  
  for (lVar5 = 0; lVar5 != 0x1000; lVar5 = lVar5 + 1) {
    filling[lVar5] = 'a';
  }
  filling[0x1000] = '\0';
  puVar6 = (undefined4 *)__xmlGetWarningsDefaultValue();
  *puVar6 = 0;
  xmlPedanticParserDefault(0);
  xmlMemSetup(xmlMemFree,xmlMemMalloc,xmlMemRealloc,xmlMemoryStrdup);
  xmlInitParser();
  xmlSetExternalEntityLoader(testExternalEntityLoader);
  xmlSetStructuredErrorFunc(0,testStructuredErrorHandler);
  iVar3 = xmlRegisterInputCallbacks(hugeMatch,hugeOpen,hugeRead,hugeClose);
  if (iVar3 < 0) {
    pcVar10 = "failed to register Huge handlers\n";
    sStack_40 = 0x21;
  }
  else {
    iVar3 = xmlRegisterInputCallbacks(crazyMatch,crazyOpen,crazyRead);
    if (-1 < iVar3) {
      bVar12 = false;
      for (lVar5 = 1; lVar5 < argc; lVar5 = lVar5 + 1) {
        pcVar10 = argv[lVar5];
        if (((*pcVar10 == '-') && (pcVar10[1] == 'v')) && (pcVar10[2] == '\0')) {
          verbose = '\x01';
        }
        else {
          iVar3 = strcmp(pcVar10,"-quiet");
          if (iVar3 == 0) {
            tests_quiet = '\x01';
          }
          else {
            iVar3 = strcmp(pcVar10,"-crazy");
            if (iVar3 == 0) {
              bVar12 = true;
            }
          }
        }
      }
      if (!bVar12) {
        for (lVar5 = 0; iVar2 = nb_tests, iVar3 = nb_errors, lVar5 != 2; lVar5 = lVar5 + 1) {
          if ((tests_quiet == '\0') && (testDescriptions[lVar5].desc != (char *)0x0)) {
            printf("## %s\n");
          }
          p_Var1 = testDescriptions[lVar5].func;
          for (lVar11 = 0; lVar11 != 0x120; lVar11 = lVar11 + 0x18) {
            iVar4 = 0;
            if (lVar11 != 0x18 || lVar5 != 0) {
              iVar4 = *(int *)((long)&limitDescriptions[0].fail + lVar11);
            }
            iVar4 = (*p_Var1)(*(char **)((long)&limitDescriptions[0].name + lVar11),
                              *(size_t *)((long)&limitDescriptions[0].limit + lVar11),
                              *(int *)((long)&limitDescriptions[0].options + lVar11),iVar4);
            if (iVar4 != 0) {
              nb_errors = nb_errors + 1;
            }
          }
          if (verbose == '\x01') {
            if (nb_errors == iVar3) {
              printf("Ran %d tests, no errors\n",(ulong)(uint)(nb_tests - iVar2));
            }
            else {
              printf("Ran %d tests, %d errors, %d leaks\n",(ulong)(uint)(nb_tests - iVar2));
            }
          }
        }
      }
      iVar2 = nb_tests;
      iVar3 = nb_errors;
      if (tests_quiet == '\0') {
        puts("## Crazy tests on reader");
      }
      uVar9 = 0;
      while( true ) {
        uVar8 = (uint)uVar9;
        sVar7 = strlen(crazy);
        if (sVar7 <= uVar9) break;
        iVar4 = get_crazy_fail(uVar8);
        crazy_indx = uVar8;
        iVar4 = readerTest("crazy::test",0x988680,0,iVar4);
        if (iVar4 != 0) {
          nb_errors = nb_errors + 1;
        }
        if (tests_quiet == '\0') {
          fputc((int)crazy[uVar9],_stderr);
        }
        uVar9 = (ulong)(uVar8 + 1);
      }
      if (tests_quiet == '\0') {
        puts("\n## Crazy tests on SAX");
      }
      uVar9 = 0;
      while( true ) {
        uVar8 = (uint)uVar9;
        sVar7 = strlen(crazy);
        if (sVar7 <= uVar9) break;
        iVar4 = get_crazy_fail(uVar8);
        crazy_indx = uVar8;
        iVar4 = saxTest("crazy::test",0x988680,0,iVar4);
        if (iVar4 != 0) {
          nb_errors = nb_errors + 1;
        }
        if (tests_quiet == '\0') {
          fputc((int)crazy[uVar9],_stderr);
        }
        uVar9 = (ulong)(uVar8 + 1);
      }
      if (tests_quiet == '\0') {
        fputc(10,_stderr);
      }
      if (verbose == '\x01') {
        if (nb_errors - iVar3 == 0) {
          printf("Ran %d tests, no errors\n",(ulong)(uint)(nb_tests - iVar2));
        }
        else {
          printf("Ran %d tests, %d errors, %d leaks\n",(ulong)(uint)(nb_tests - iVar2),
                 (ulong)(uint)(nb_errors - iVar3),0);
        }
      }
      bVar12 = nb_errors == 0;
      if (bVar12) {
        printf("Total %d tests, no errors\n",(ulong)(uint)nb_tests);
      }
      else {
        printf("Total %d tests, %d errors, %d leaks\n",(ulong)(uint)nb_tests,(ulong)(uint)nb_errors,
               0);
      }
      xmlCleanupParser();
      xmlMemoryDump();
      return (uint)!bVar12;
    }
    pcVar10 = "failed to register Crazy handlers\n";
    sStack_40 = 0x22;
  }
  fwrite(pcVar10,sStack_40,1,_stderr);
  exit(1);
}

Assistant:

int
main(int argc ATTRIBUTE_UNUSED, char **argv ATTRIBUTE_UNUSED) {
    int i, a, ret = 0;
    int subset = 0;

    fillFilling();
    initializeLibxml2();

    for (a = 1; a < argc;a++) {
        if (!strcmp(argv[a], "-v"))
	    verbose = 1;
        else if (!strcmp(argv[a], "-quiet"))
	    tests_quiet = 1;
        else if (!strcmp(argv[a], "-crazy"))
	    subset = 1;
    }
    if (subset == 0) {
	for (i = 0; testDescriptions[i].func != NULL; i++) {
	    ret += runtest(i);
	}
    }
    ret += runcrazy();
    if ((nb_errors == 0) && (nb_leaks == 0)) {
        ret = 0;
	printf("Total %d tests, no errors\n",
	       nb_tests);
    } else {
        ret = 1;
	printf("Total %d tests, %d errors, %d leaks\n",
	       nb_tests, nb_errors, nb_leaks);
    }
    xmlCleanupParser();
    xmlMemoryDump();

    return(ret);
}